

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O1

void __thiscall embree::SubdivMesh::updateBuffer(SubdivMesh *this,RTCBufferType type,uint slot)

{
  uint *puVar1;
  Topology *pTVar2;
  ulong uVar3;
  undefined8 *puVar4;
  RawBufferView *pRVar5;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (type == RTC_BUFFER_TYPE_LEVEL) {
    if (slot != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid buffer slot","");
      *puVar4 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar4 + 1) = 2;
      puVar4[2] = puVar4 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar4 + 2),local_40,local_40 + local_38)
      ;
      __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    puVar1 = &(this->levels).super_RawBufferView.modCounter;
    *puVar1 = *puVar1 + 1;
    (this->levels).super_RawBufferView.modified = true;
  }
  else {
    this->commitCounter = this->commitCounter + 1;
    if ((int)type < 0x10) {
      if (type == RTC_BUFFER_TYPE_INDEX) {
        uVar3 = (ulong)slot;
        if ((this->topology).size_active <= uVar3) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
          local_40 = local_30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"invalid buffer slot","");
          *puVar4 = &PTR__rtcore_error_022018b0;
          *(undefined4 *)(puVar4 + 1) = 2;
          puVar4[2] = puVar4 + 4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar4 + 2),local_40,local_40 + local_38);
          __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
        }
        pTVar2 = (this->topology).items;
        puVar1 = &pTVar2[uVar3].vertexIndices.super_RawBufferView.modCounter;
        *puVar1 = *puVar1 + 1;
        pTVar2[uVar3].vertexIndices.super_RawBufferView.modified = true;
      }
      else {
        if (type == RTC_BUFFER_TYPE_VERTEX) {
          if ((this->vertices).size_active <= (ulong)slot) {
            puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
            local_40 = local_30;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,"invalid buffer slot","");
            *puVar4 = &PTR__rtcore_error_022018b0;
            *(undefined4 *)(puVar4 + 1) = 2;
            puVar4[2] = puVar4 + 4;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar4 + 2),local_40,local_40 + local_38);
            __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
          }
          pRVar5 = &((this->vertices).items)->super_RawBufferView;
        }
        else {
          if (type != RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) goto switchD_00e13513_caseD_11;
          if ((this->vertexAttribs).size_active <= (ulong)slot) {
            puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
            local_40 = local_30;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,"invalid buffer slot","");
            *puVar4 = &PTR__rtcore_error_022018b0;
            *(undefined4 *)(puVar4 + 1) = 2;
            puVar4[2] = puVar4 + 4;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar4 + 2),local_40,local_40 + local_38);
            __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
          }
          pRVar5 = (this->vertexAttribs).items;
        }
        pRVar5[slot].modCounter = pRVar5[slot].modCounter + 1;
        pRVar5[slot].modified = true;
      }
    }
    else {
      switch(type) {
      case RTC_BUFFER_TYPE_FACE:
        if (slot != 0) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
          local_40 = local_30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"invalid buffer slot","");
          *puVar4 = &PTR__rtcore_error_022018b0;
          *(undefined4 *)(puVar4 + 1) = 2;
          puVar4[2] = puVar4 + 4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar4 + 2),local_40,local_40 + local_38);
          __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
        }
        puVar1 = &(this->faceVertices).super_RawBufferView.modCounter;
        *puVar1 = *puVar1 + 1;
        (this->faceVertices).super_RawBufferView.modified = true;
        break;
      default:
switchD_00e13513_caseD_11:
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_40 = local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"unknown buffer type","");
        *puVar4 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar4 + 1) = 2;
        puVar4[2] = puVar4 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar4 + 2),local_40,local_40 + local_38);
        __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      case RTC_BUFFER_TYPE_EDGE_CREASE_INDEX:
        if (slot != 0) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
          local_40 = local_30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"invalid buffer slot","");
          *puVar4 = &PTR__rtcore_error_022018b0;
          *(undefined4 *)(puVar4 + 1) = 2;
          puVar4[2] = puVar4 + 4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar4 + 2),local_40,local_40 + local_38);
          __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
        }
        puVar1 = &(this->edge_creases).super_RawBufferView.modCounter;
        *puVar1 = *puVar1 + 1;
        (this->edge_creases).super_RawBufferView.modified = true;
        break;
      case RTC_BUFFER_TYPE_EDGE_CREASE_WEIGHT:
        if (slot != 0) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
          local_40 = local_30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"invalid buffer slot","");
          *puVar4 = &PTR__rtcore_error_022018b0;
          *(undefined4 *)(puVar4 + 1) = 2;
          puVar4[2] = puVar4 + 4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar4 + 2),local_40,local_40 + local_38);
          __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
        }
        puVar1 = &(this->edge_crease_weights).super_RawBufferView.modCounter;
        *puVar1 = *puVar1 + 1;
        (this->edge_crease_weights).super_RawBufferView.modified = true;
        break;
      case RTC_BUFFER_TYPE_VERTEX_CREASE_INDEX:
        if (slot != 0) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
          local_40 = local_30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"invalid buffer slot","");
          *puVar4 = &PTR__rtcore_error_022018b0;
          *(undefined4 *)(puVar4 + 1) = 2;
          puVar4[2] = puVar4 + 4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar4 + 2),local_40,local_40 + local_38);
          __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
        }
        puVar1 = &(this->vertex_creases).super_RawBufferView.modCounter;
        *puVar1 = *puVar1 + 1;
        (this->vertex_creases).super_RawBufferView.modified = true;
        break;
      case RTC_BUFFER_TYPE_VERTEX_CREASE_WEIGHT:
        if (slot != 0) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
          local_40 = local_30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"invalid buffer slot","");
          *puVar4 = &PTR__rtcore_error_022018b0;
          *(undefined4 *)(puVar4 + 1) = 2;
          puVar4[2] = puVar4 + 4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar4 + 2),local_40,local_40 + local_38);
          __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
        }
        puVar1 = &(this->vertex_crease_weights).super_RawBufferView.modCounter;
        *puVar1 = *puVar1 + 1;
        (this->vertex_crease_weights).super_RawBufferView.modified = true;
        break;
      case RTC_BUFFER_TYPE_HOLE:
        if (slot != 0) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
          local_40 = local_30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"invalid buffer slot","");
          *puVar4 = &PTR__rtcore_error_022018b0;
          *(undefined4 *)(puVar4 + 1) = 2;
          puVar4[2] = puVar4 + 4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar4 + 2),local_40,local_40 + local_38);
          __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
        }
        puVar1 = &(this->holes).super_RawBufferView.modCounter;
        *puVar1 = *puVar1 + 1;
        (this->holes).super_RawBufferView.modified = true;
      }
    }
  }
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void SubdivMesh::updateBuffer(RTCBufferType type, unsigned int slot)
  {
    if (type != RTC_BUFFER_TYPE_LEVEL)
      commitCounter++;

    if (type == RTC_BUFFER_TYPE_VERTEX)
    {
      if (slot >= vertices.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertices[slot].setModified();
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE)
    {
      if (slot >= vertexAttribs.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertexAttribs[slot].setModified();
    }
    else if (type == RTC_BUFFER_TYPE_FACE)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      faceVertices.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_INDEX)
    {
      if (slot >= topology.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      topology[slot].vertexIndices.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_EDGE_CREASE_INDEX)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      edge_creases.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_EDGE_CREASE_WEIGHT)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      edge_crease_weights.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX_CREASE_INDEX)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertex_creases.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX_CREASE_WEIGHT)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertex_crease_weights.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_HOLE)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      holes.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_LEVEL)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      levels.setModified();
    }
    else
    {
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
    }

    Geometry::update();
  }